

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Polyobj_MoveToSpot
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool bVar1;
  uint uVar2;
  AActor *pAVar3;
  DVector2 local_10;
  
  uVar2 = 0;
  if (arg2 == 0) {
    pAVar3 = (AActor *)0x0;
  }
  else {
    for (pAVar3 = AActor::TIDHash[arg2 & 0x7f]; (pAVar3 != (AActor *)0x0 && (pAVar3->tid != arg2));
        pAVar3 = pAVar3->inext) {
    }
  }
  if (pAVar3 != (AActor *)0x0) {
    local_10.X = (pAVar3->__Pos).X;
    local_10.Y = (pAVar3->__Pos).Y;
    bVar1 = EV_MovePolyTo((line_t_conflict *)ln,arg0,(double)arg1 * 0.125,&local_10,false);
    uVar2 = (uint)bVar1;
  }
  return uVar2;
}

Assistant:

FUNC(LS_Polyobj_MoveToSpot)
// Polyobj_MoveToSpot (po, speed, tid)
{
	FActorIterator iterator (arg2);
	AActor *spot = iterator.Next();
	if (spot == NULL) return false;
	return EV_MovePolyTo (ln, arg0, SPEED(arg1), spot->Pos(), false);
}